

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricProgrammableGetPropertiesExp
          (zet_metric_programmable_exp_handle_t hMetricProgrammable,
          zet_metric_programmable_exp_properties_t *pProperties)

{
  zet_pfnMetricProgrammableGetPropertiesExp_t pfnGetPropertiesExp;
  ze_result_t result;
  zet_metric_programmable_exp_properties_t *pProperties_local;
  zet_metric_programmable_exp_handle_t hMetricProgrammable_local;
  
  pfnGetPropertiesExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c798 != (code *)0x0) {
    pfnGetPropertiesExp._4_4_ = (*DAT_0011c798)(hMetricProgrammable,pProperties);
  }
  return pfnGetPropertiesExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricProgrammableGetPropertiesExp(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        zet_metric_programmable_exp_properties_t* pProperties   ///< [in,out] properties of the metric programmable
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetPropertiesExp = context.zetDdiTable.MetricProgrammableExp.pfnGetPropertiesExp;
        if( nullptr != pfnGetPropertiesExp )
        {
            result = pfnGetPropertiesExp( hMetricProgrammable, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }